

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O3

void __thiscall CProfileIterator::Enter_Child(CProfileIterator *this,int index)

{
  CProfileNode *pCVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  pCVar1 = this->CurrentParent->Child;
  this->CurrentChild = pCVar1;
  bVar4 = pCVar1 != (CProfileNode *)0x0;
  if (index != 0 && bVar4) {
    iVar2 = index + -1;
    do {
      pCVar1 = pCVar1->Sibling;
      this->CurrentChild = pCVar1;
      bVar3 = iVar2 != 0;
      iVar2 = iVar2 + -1;
      bVar4 = pCVar1 != (CProfileNode *)0x0;
      if (pCVar1 == (CProfileNode *)0x0) break;
    } while (bVar3);
  }
  if (bVar4) {
    this->CurrentParent = pCVar1;
    this->CurrentChild = pCVar1->Child;
  }
  return;
}

Assistant:

void	CProfileIterator::Enter_Child( int index )
{
	CurrentChild = CurrentParent->Get_Child();
	while ( (CurrentChild != NULL) && (index != 0) ) {
		index--;
		CurrentChild = CurrentChild->Get_Sibling();
	}

	if ( CurrentChild != NULL ) {
		CurrentParent = CurrentChild;
		CurrentChild = CurrentParent->Get_Child();
	}
}